

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

bool __thiscall nuraft::inmem_log_store::compact(inmem_log_store *this,ulong last_log_index)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  const_iterator __position;
  ulong uVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar3 == 0) {
    uVar5 = (this->start_idx_).super___atomic_base<unsigned_long>._M_i;
    if (uVar5 <= last_log_index) {
      p_Var1 = &(this->logs_)._M_t._M_impl.super__Rb_tree_header;
      do {
        p_Var2 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 = &p_Var1->_M_header;
        for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar5]
            ) {
          if (*(ulong *)(p_Var2 + 1) >= uVar5) {
            p_Var4 = p_Var2;
          }
        }
        __position._M_node = &p_Var1->_M_header;
        if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
           (__position._M_node = p_Var4, uVar5 < *(ulong *)(p_Var4 + 1))) {
          __position._M_node = &p_Var1->_M_header;
        }
        if ((_Rb_tree_header *)__position._M_node != p_Var1) {
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
          ::_M_erase_aux(&(this->logs_)._M_t,__position);
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 <= last_log_index);
    }
    if ((this->start_idx_).super___atomic_base<unsigned_long>._M_i <= last_log_index) {
      LOCK();
      (this->start_idx_).super___atomic_base<unsigned_long>._M_i = last_log_index + 1;
      UNLOCK();
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
    return true;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool inmem_log_store::compact(ulong last_log_index) {
    std::lock_guard<std::mutex> l(logs_lock_);
    for (ulong ii = start_idx_; ii <= last_log_index; ++ii) {
        auto entry = logs_.find(ii);
        if (entry != logs_.end()) {
            logs_.erase(entry);
        }
    }

    // WARNING:
    //   Even though nothing has been erased,
    //   we should set `start_idx_` to new index.
    if (start_idx_ <= last_log_index) {
        start_idx_ = last_log_index + 1;
    }
    return true;
}